

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O1

Operand * TR_Args(Operand *__return_storage_ptr__,ast *node,bool isPush)

{
  ast *paVar1;
  Operand OStack_e8;
  InterCode local_b8;
  
  IrSim::newTmpVar(__return_storage_ptr__,&irSim);
  paVar1 = sibling(node,2);
  TR_Exp(node,__return_storage_ptr__);
  if (paVar1 != (ast *)0x0) {
    paVar1 = child(paVar1,1);
    TR_Args(&OStack_e8,paVar1,isPush);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)OStack_e8.value._M_dataplus._M_p != &OStack_e8.value.field_2) {
      operator_delete(OStack_e8.value._M_dataplus._M_p);
    }
  }
  if (isPush) {
    IrSim::icArg(&local_b8,&irSim,__return_storage_ptr__);
    IrSim::commitIc(&irSim,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.arg2.value._M_dataplus._M_p != &local_b8.arg2.value.field_2) {
      operator_delete(local_b8.arg2.value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.arg1.value._M_dataplus._M_p != &local_b8.arg1.value.field_2) {
      operator_delete(local_b8.arg1.value._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.target.value._M_dataplus._M_p != &local_b8.target.value.field_2) {
      operator_delete(local_b8.target.value._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Operand TR_Args(ast *node, bool isPush) {
    Operand t1 = irSim.newTmpVar();
    ast *s2 = sibling(node, 2);
    TR_Exp(node, t1);
//    irSim.useLastArrayAddr();
    if (s2) TR_Args(child(s2, 1), isPush);
    if (isPush) irSim << irSim.icArg(t1);
    return t1;
}